

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_json_mapping_base.h
# Opt level: O2

vector<PsbtBip32DataStruct,_std::allocator<PsbtBip32DataStruct>_> * __thiscall
cfd::core::JsonObjectVector<cfd::api::json::PsbtBip32Data,_PsbtBip32DataStruct>::ConvertToStruct
          (vector<PsbtBip32DataStruct,_std::allocator<PsbtBip32DataStruct>_> *__return_storage_ptr__
          ,JsonObjectVector<cfd::api::json::PsbtBip32Data,_PsbtBip32DataStruct> *this)

{
  pointer pPVar1;
  pointer this_00;
  PsbtBip32DataStruct data;
  PsbtBip32DataStruct local_d0;
  
  (__return_storage_ptr__->
  super__Vector_base<PsbtBip32DataStruct,_std::allocator<PsbtBip32DataStruct>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<PsbtBip32DataStruct,_std::allocator<PsbtBip32DataStruct>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<PsbtBip32DataStruct,_std::allocator<PsbtBip32DataStruct>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pPVar1 = (this->super_JsonVector<cfd::api::json::PsbtBip32Data>).
           super_vector<cfd::api::json::PsbtBip32Data,_std::allocator<cfd::api::json::PsbtBip32Data>_>
           .
           super__Vector_base<cfd::api::json::PsbtBip32Data,_std::allocator<cfd::api::json::PsbtBip32Data>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (this_00 = (this->super_JsonVector<cfd::api::json::PsbtBip32Data>).
                 super_vector<cfd::api::json::PsbtBip32Data,_std::allocator<cfd::api::json::PsbtBip32Data>_>
                 .
                 super__Vector_base<cfd::api::json::PsbtBip32Data,_std::allocator<cfd::api::json::PsbtBip32Data>_>
                 ._M_impl.super__Vector_impl_data._M_start; this_00 != pPVar1; this_00 = this_00 + 1
      ) {
    cfd::api::json::PsbtBip32Data::ConvertToStruct(&local_d0,this_00);
    ::std::vector<PsbtBip32DataStruct,_std::allocator<PsbtBip32DataStruct>_>::push_back
              (__return_storage_ptr__,&local_d0);
    PsbtBip32DataStruct::~PsbtBip32DataStruct(&local_d0);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<STRUCT_TYPE> ConvertToStruct() const {
    std::vector<STRUCT_TYPE> result;
    for (const auto& element : *this) {
      STRUCT_TYPE data = element.ConvertToStruct();
      result.push_back(data);
    }
    return result;
  }